

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O3

void __thiscall
ExprVisitorTest_VisitNumericConstant_Test::TestBody(ExprVisitorTest_VisitNumericConstant_Test *this)

{
  StrictMock<MockVisitor> *this_00;
  bool bVar1;
  NumericConstant value;
  MockSpec<TestResult_(mp::NumericConstant)> *this_01;
  MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)> *this_02;
  logic_error *this_03;
  char *message;
  FunctionMocker<TestResult_(mp::NumericConstant)> *this_04;
  AssertionResult gtest_ar;
  StrictMock<MockUnhandledVisitor> visitor;
  Matcher<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_110;
  undefined1 local_f8 [8];
  undefined1 local_f0 [208];
  
  value = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                    (&(this->super_ExprVisitorTest).factory_,42.0);
  this_00 = &(this->super_ExprVisitorTest).visitor_;
  testing::Matcher<mp::NumericConstant>::Matcher((Matcher<mp::NumericConstant> *)local_f8,value);
  this_04 = &(this->super_ExprVisitorTest).visitor_.super_MockVisitor.gmock1_VisitNumericConstant_81
  ;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_04,this_00);
  this_01 = testing::internal::FunctionMocker<TestResult_(mp::NumericConstant)>::With
                      (this_04,(Matcher<mp::NumericConstant> *)local_f8);
  testing::internal::MockSpec<TestResult_(mp::NumericConstant)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0xe3,"visitor_","VisitNumericConstant(e)");
  local_f8 = (undefined1  [8])&PTR__MatcherBase_001e1218;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::NumericConstant>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::NumericConstant>_> *)local_f0);
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)this_00,
             (Expr)value.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_)
  ;
  testing::AssertionSuccess();
  if (local_110.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>.
      _vptr_MatcherBase._0_1_ == true) {
    if (0x47 < *(uint *)value.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                        impl_) {
      this_03 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_03,"invalid expression kind");
      *(undefined ***)this_03 = &PTR__logic_error_001e2c88;
      __cxa_throw(this_03,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
    }
    fmt::format<char_const*>
              ((string *)local_f8,(fmt *)"unsupported: {}",(CStringRef)&stack0xfffffffffffffee8,
               (char **)mp::internal::ExprInfo::INFO);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::Mock::FailUninterestingCalls(&stack0xfffffffffffffee8);
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 &stack0xfffffffffffffee8,
                 (Expr)value.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                       impl_);
      testing::Mock::UnregisterCallReaction(&PTR__StrictMock_001e44f8);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_110,
               (char (*) [127])
               "Expected: StrictMock<NullVisitor>().Visit(base) throws an exception of type mp::UnsupportedError.\n  Actual: it throws nothing."
              );
    if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
      operator_delete((void *)local_f8,(ulong)(local_f0._8_8_ + 1));
    }
  }
  testing::Message::Message((Message *)local_f8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_110.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>.impl_.
      value_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((_Alloc_hider *)
              &(local_110.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>.
                impl_.value_)->super_MatcherDescriberInterface)->_M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xfffffffffffffee8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0xe6,message);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xfffffffffffffee8,(Message *)local_f8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffee8);
  if (((local_f8 != (undefined1  [8])0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_f8 != (undefined1  [8])0x0)) {
    (**(code **)(*(_func_int **)local_f8 + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>.impl_
        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::StrictMock<MockUnhandledVisitor>::StrictMock
            ((StrictMock<MockUnhandledVisitor> *)local_f8);
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::Matcher
            (&local_110,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
             value.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)local_f0,local_f8);
  this_02 = testing::internal::
            FunctionMocker<TestResult_(mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)>::With
                      ((FunctionMocker<TestResult_(mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)>
                        *)local_f0,&local_110);
  testing::internal::MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)>::
  InternalExpectedAt(this_02,
                     "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
                     ,0xe6,"visitor","VisitNumeric(base)");
  local_110.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001e2cf8;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ::~linked_ptr(&local_110.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>.
                 impl_);
  mp::BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes> *)local_f8
             ,(Expr)value.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_
            );
  testing::StrictMock<MockUnhandledVisitor>::~StrictMock
            ((StrictMock<MockUnhandledVisitor> *)local_f8);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitNumericConstant) {
  auto e = factory_.MakeNumericConstant(42);
  EXPECT_CALL(visitor_, VisitNumericConstant(e));
  mp::NumericExpr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED_NUMERIC(base);
}